

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

void opj_jp2_apply_cdef(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *manager)

{
  ushort uVar1;
  opj_image_comp_t *poVar2;
  opj_image_comp_t *poVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  OPJ_INT32 *pOVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  OPJ_INT32 *pOVar10;
  undefined8 uVar11;
  opj_image_comp_t *poVar12;
  ulong uVar13;
  OPJ_UINT32 OVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  OPJ_UINT32 OVar23;
  OPJ_UINT32 OVar24;
  OPJ_UINT32 OVar25;
  OPJ_UINT32 OVar26;
  OPJ_UINT32 OVar27;
  OPJ_UINT32 OVar28;
  opj_jp2_cdef_info_t *poVar29;
  char *fmt;
  opj_jp2_cdef_info_t *poVar30;
  ulong uVar31;
  ushort uVar32;
  opj_jp2_cdef_t *ptr;
  ulong uVar33;
  ushort uVar34;
  ulong uVar35;
  opj_jp2_cdef_info_t *ptr_00;
  ulong uVar36;
  opj_image_comp_t saved;
  
  ptr = color->jp2_cdef;
  ptr_00 = ptr->info;
  uVar35 = (ulong)ptr->n;
  if (uVar35 != 0) {
    uVar31 = 1;
    uVar36 = 0;
    poVar30 = ptr_00;
    do {
      poVar30 = poVar30 + 1;
      uVar1 = ptr_00[uVar36].cn;
      uVar33 = (ulong)uVar1;
      if ((uint)uVar1 < image->numcomps) {
        if (1 < (ushort)(ptr_00[uVar36].asoc + 1)) {
          uVar32 = ptr_00[uVar36].asoc - 1;
          if (image->numcomps <= (uint)uVar32) {
            fmt = "opj_jp2_apply_cdef: acn=%d, numcomps=%d\n";
            uVar33 = (ulong)(uint)uVar32;
            goto LAB_0011d1ee;
          }
          if ((uVar1 != uVar32) && (ptr_00[uVar36].typ == 0)) {
            poVar2 = image->comps;
            poVar3 = poVar2 + uVar1;
            OVar25 = poVar3->dx;
            OVar26 = poVar3->dy;
            OVar27 = poVar3->w;
            OVar28 = poVar3->h;
            poVar3 = poVar2 + uVar1;
            OVar21 = poVar3->x0;
            OVar22 = poVar3->y0;
            uVar4 = *(undefined8 *)(&poVar3->x0 + 2);
            poVar3 = poVar2 + uVar1;
            OVar23 = poVar3->sgnd;
            OVar24 = poVar3->resno_decoded;
            uVar5 = *(undefined8 *)(&poVar3->sgnd + 2);
            pOVar6 = poVar2[uVar1].data;
            uVar7 = (&poVar2[uVar1].data)[1];
            poVar3 = poVar2 + uVar32;
            OVar14 = poVar3->dy;
            OVar15 = poVar3->w;
            OVar16 = poVar3->h;
            poVar12 = poVar2 + uVar32;
            OVar17 = poVar12->x0;
            OVar18 = poVar12->y0;
            uVar8 = *(undefined8 *)(&poVar12->x0 + 2);
            poVar12 = poVar2 + uVar32;
            OVar19 = poVar12->sgnd;
            OVar20 = poVar12->resno_decoded;
            uVar9 = *(undefined8 *)(&poVar12->sgnd + 2);
            pOVar10 = poVar2[uVar32].data;
            uVar11 = (&poVar2[uVar32].data)[1];
            poVar12 = poVar2 + uVar1;
            poVar12->dx = poVar3->dx;
            poVar12->dy = OVar14;
            poVar12->w = OVar15;
            poVar12->h = OVar16;
            poVar3 = poVar2 + uVar1;
            poVar3->x0 = OVar17;
            poVar3->y0 = OVar18;
            *(undefined8 *)(&poVar3->x0 + 2) = uVar8;
            poVar3 = poVar2 + uVar1;
            poVar3->sgnd = OVar19;
            poVar3->resno_decoded = OVar20;
            *(undefined8 *)(&poVar3->sgnd + 2) = uVar9;
            poVar2[uVar1].data = pOVar10;
            (&poVar2[uVar1].data)[1] = (OPJ_INT32 *)uVar11;
            poVar3 = image->comps;
            poVar12 = poVar3 + uVar32;
            poVar12->x0 = OVar21;
            poVar12->y0 = OVar22;
            *(undefined8 *)(&poVar12->x0 + 2) = uVar4;
            poVar12 = poVar3 + uVar32;
            poVar12->sgnd = OVar23;
            poVar12->resno_decoded = OVar24;
            *(undefined8 *)(&poVar12->sgnd + 2) = uVar5;
            poVar3[uVar32].data = pOVar6;
            (&poVar3[uVar32].data)[1] = (OPJ_INT32 *)uVar7;
            poVar3 = poVar3 + uVar32;
            poVar3->dx = OVar25;
            poVar3->dy = OVar26;
            poVar3->w = OVar27;
            poVar3->h = OVar28;
            poVar29 = poVar30;
            uVar33 = uVar31;
            uVar13 = uVar36 + 1;
            while (uVar13 < uVar35) {
              uVar34 = uVar32;
              if ((poVar29->cn == uVar1) || (uVar34 = uVar1, poVar29->cn == uVar32)) {
                poVar29->cn = uVar34;
              }
              poVar29 = poVar29 + 1;
              uVar33 = uVar33 + 1;
              uVar13 = uVar33;
            }
          }
        }
        image->comps[uVar1].alpha = ptr_00[uVar36].typ;
      }
      else {
        fmt = "opj_jp2_apply_cdef: cn=%d, numcomps=%d\n";
LAB_0011d1ee:
        opj_event_msg(manager,2,fmt,uVar33);
      }
      uVar36 = uVar36 + 1;
      uVar31 = uVar31 + 1;
    } while (uVar36 != uVar35);
    ptr = color->jp2_cdef;
    ptr_00 = ptr->info;
  }
  if (ptr_00 != (opj_jp2_cdef_info_t *)0x0) {
    opj_free(ptr_00);
    ptr = color->jp2_cdef;
  }
  opj_free(ptr);
  color->jp2_cdef = (opj_jp2_cdef_t *)0x0;
  return;
}

Assistant:

static void opj_jp2_apply_cdef(opj_image_t *image, opj_jp2_color_t *color,
                               opj_event_mgr_t *manager)
{
    opj_jp2_cdef_info_t *info;
    OPJ_UINT16 i, n, cn, asoc, acn;

    info = color->jp2_cdef->info;
    n = color->jp2_cdef->n;

    for (i = 0; i < n; ++i) {
        /* WATCH: acn = asoc - 1 ! */
        asoc = info[i].asoc;
        cn = info[i].cn;

        if (cn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: cn=%d, numcomps=%d\n",
                          cn, image->numcomps);
            continue;
        }
        if (asoc == 0 || asoc == 65535) {
            image->comps[cn].alpha = info[i].typ;
            continue;
        }

        acn = (OPJ_UINT16)(asoc - 1);
        if (acn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: acn=%d, numcomps=%d\n",
                          acn, image->numcomps);
            continue;
        }

        /* Swap only if color channel */
        if ((cn != acn) && (info[i].typ == 0)) {
            opj_image_comp_t saved;
            OPJ_UINT16 j;

            memcpy(&saved, &image->comps[cn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[cn], &image->comps[acn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[acn], &saved, sizeof(opj_image_comp_t));

            /* Swap channels in following channel definitions, don't bother with j <= i that are already processed */
            for (j = (OPJ_UINT16)(i + 1U); j < n ; ++j) {
                if (info[j].cn == cn) {
                    info[j].cn = acn;
                } else if (info[j].cn == acn) {
                    info[j].cn = cn;
                }
                /* asoc is related to color index. Do not update. */
            }
        }

        image->comps[cn].alpha = info[i].typ;
    }

    if (color->jp2_cdef->info) {
        opj_free(color->jp2_cdef->info);
    }

    opj_free(color->jp2_cdef);
    color->jp2_cdef = NULL;

}